

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tools::xar::(anonymous_namespace)::read_file_prefix_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char *filename,size_t max_bytes)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  string buf;
  undefined1 *local_38;
  size_t local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  iVar3 = open((char *)this,0x80000);
  if (iVar3 < 0) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    return __return_storage_ptr__;
  }
  local_30 = 0;
  local_28 = 0;
  local_38 = &local_28;
  std::__cxx11::string::resize((ulong)&local_38,'\0');
  sVar4 = read(iVar3,local_38,local_30);
  if (-1 < sVar4) {
    std::__cxx11::string::resize((ulong)&local_38,(char)sVar4);
    iVar3 = close(iVar3);
    if (-1 < iVar3) {
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload = puVar1;
      if (local_38 == &local_28) {
        *puVar1 = CONCAT71(uStack_27,local_28);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x18) = uStack_20;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload = local_38;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10) = CONCAT71(uStack_27,local_28);
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = local_30;
      local_30 = 0;
      local_28 = 0;
      bVar2 = true;
      local_38 = &local_28;
      goto LAB_001083f0;
    }
  }
  bVar2 = false;
LAB_001083f0:
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = bVar2;
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> read_file_prefix(
    const char* filename,
    size_t max_bytes) {
  int fd = open(filename, O_RDONLY | O_CLOEXEC);
  if (fd < 0) {
    return std::nullopt;
  }

  std::string buf;
  buf.resize(max_bytes);
  ssize_t res = read(fd, &buf[0], buf.size());
  if (res < 0) {
    return std::nullopt;
  }
  buf.resize(res);
  res = close(fd);
  if (res < 0) {
    return std::nullopt;
  }

  return buf;
}